

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O1

ON_Font * __thiscall
ON_FontList::FontFromQuartetProperties
          (ON_FontList *this,wchar_t *quartet_name,bool bBold,bool bItalic)

{
  int iVar1;
  ON_FontFaceQuartet *pOVar2;
  ON_Font *pOVar3;
  long lVar4;
  uint uVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  ON_ClassArray<ON_FontFaceQuartet> *this_00;
  char cVar9;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  int iVar10;
  ON_Font *pOVar11;
  ON_FontFaceQuartet qname;
  ON_wString OStack_68;
  uint local_60;
  uint local_5c;
  ON_FontFaceQuartet local_58;
  
  ON_FontFaceQuartet::ON_FontFaceQuartet
            (&local_58,quartet_name,(ON_Font *)0x0,(ON_Font *)0x0,(ON_Font *)0x0,(ON_Font *)0x0);
  ON_wString::ON_wString(&OStack_68,&local_58.m_quartet_name);
  bVar6 = ON_wString::IsEmpty(&OStack_68);
  ON_wString::~ON_wString(&OStack_68);
  if (!bVar6) {
    this_00 = QuartetList(this);
    iVar1 = this_00->m_count;
    uVar7 = ON_ClassArray<ON_FontFaceQuartet>::BinarySearch
                      (this_00,&local_58,ON_FontFaceQuartet::CompareQuartetName);
    if ((int)uVar7 < iVar1 && -1 < (int)uVar7) {
      local_60 = (uint)CONCAT71(in_register_00000011,bBold);
      local_5c = (uint)CONCAT71(in_register_00000009,bItalic);
      pOVar11 = (ON_Font *)(ulong)uVar7;
      iVar10 = uVar7 + 1;
      lVar4 = (long)pOVar11 * 0x28;
      do {
        if ((long)pOVar11 < 1) {
          iVar10 = 0;
          break;
        }
        iVar8 = ON_FontFaceQuartet::CompareQuartetName
                          (&local_58,
                           (ON_FontFaceQuartet *)
                           ((long)&this_00->m_a[-1].m_quartet_name.m_s + lVar4));
        iVar10 = iVar10 + -1;
        pOVar11 = (ON_Font *)((long)&pOVar11[-1].m_managed_installed_font_and_bits + 7);
        lVar4 = lVar4 + -0x28;
      } while (iVar8 == 0);
      uVar5 = local_5c & 0xff;
      uVar7 = local_60 & 0xff;
      do {
        pOVar2 = this_00->m_a;
        iVar8 = ON_FontFaceQuartet::CompareQuartetName(&local_58,pOVar2 + iVar10);
        cVar9 = '\x04';
        if (iVar8 == 0) {
          pOVar3 = *(ON_Font **)
                    ((long)&pOVar2[iVar10].m_regular + (ulong)(uVar5 * 0x10 + uVar7 * 8));
          bVar6 = pOVar3 == (ON_Font *)0x0;
          cVar9 = !bVar6;
          if (!bVar6) {
            pOVar11 = pOVar3;
          }
          iVar10 = iVar10 + (uint)bVar6;
        }
        if (cVar9 != '\0') {
          if (cVar9 != '\x04') goto LAB_00483b75;
          break;
        }
      } while (iVar10 < iVar1);
    }
  }
  pOVar11 = (ON_Font *)0x0;
LAB_00483b75:
  ON_wString::~ON_wString(&local_58.m_quartet_name);
  return pOVar11;
}

Assistant:

const ON_Font* ON_FontList::FontFromQuartetProperties(
  const wchar_t* quartet_name,
  bool bBold,
  bool bItalic
) const
{
  const ON_FontFaceQuartet qname(quartet_name, nullptr, nullptr, nullptr, nullptr);
  if (qname.QuartetName().IsEmpty())
    return nullptr;

  const ON_ClassArray< ON_FontFaceQuartet >& quartet_list = ON_FontList::QuartetList();
  const int quartet_list_count = quartet_list.Count();
  int i = quartet_list.BinarySearch(&qname, ON_FontFaceQuartet::CompareQuartetName);
  if (i < 0 || i >= quartet_list_count)
    return nullptr;

  while (i > 0 && 0 == ON_FontFaceQuartet::CompareQuartetName(&qname, &quartet_list[i - 1]))
    i--;
  
  do
  {
    const ON_FontFaceQuartet& q = quartet_list[i];
    if (0 != ON_FontFaceQuartet::CompareQuartetName(&qname, &q))
      break;
    const ON_Font* font = q.Face(bBold, bItalic);
    if (nullptr != font)
      return font;
    i++;
  } while (i < quartet_list_count);

  return nullptr;
}